

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.cc
# Opt level: O1

void __thiscall
gimage::ImageIO::loadHeader(ImageIO *this,char *name,long *width,long *height,int *depth)

{
  int iVar1;
  ulong uVar2;
  BasicImageIO *pBVar3;
  ulong uVar4;
  string s;
  long tborder;
  long theight;
  long twidth;
  string suffix;
  string prefix;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  list;
  
  std::__cxx11::string::string((string *)&s,name,(allocator *)&list);
  uVar4 = 0xffffffffffffffff;
  uVar2 = std::__cxx11::string::rfind((char)&s,0x3a);
  if (uVar2 != 0xffffffffffffffff) {
    iVar1 = std::__cxx11::string::compare((ulong)&s,uVar2,(char *)0x2);
    uVar4 = -(ulong)(iVar1 == 0) | uVar2;
  }
  if (uVar4 == 0xffffffffffffffff) {
    pBVar3 = getBasicImageIO(this,name,true);
    (*pBVar3->_vptr_BasicImageIO[4])(pBVar3,name,width,height,depth);
  }
  else {
    std::__cxx11::string::substr((ulong)&prefix,(ulong)&s);
    std::__cxx11::string::substr((ulong)&suffix,(ulong)&s);
    list._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &list._M_t._M_impl.super__Rb_tree_header._M_header;
    list._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    list._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    list._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    list._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         list._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    pBVar3 = getBasicImageIO(this,name,true);
    anon_unknown_17::loadTiledHeader
              (pBVar3,&list,&prefix,&suffix,&twidth,&theight,&tborder,width,height,depth);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&list._M_t);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)suffix._M_dataplus._M_p != &suffix.field_2) {
      operator_delete(suffix._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)prefix._M_dataplus._M_p != &prefix.field_2) {
      operator_delete(prefix._M_dataplus._M_p);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)s._M_dataplus._M_p != &s.field_2) {
    operator_delete(s._M_dataplus._M_p);
  }
  return;
}

Assistant:

void ImageIO::loadHeader(const char *name, long &width, long &height,
                         int &depth) const
{
  std::string s=name;
  size_t pos=s.rfind(':');

  if (pos != s.npos && s.compare(pos, 2, ":\\") == 0)
  {
    pos=s.npos;
  }

  if (pos != s.npos)
  {
    try
    {
      // extract prefix and suffix from file name

      std::string prefix=s.substr(0, pos);
      std::string suffix=s.substr(pos+1);

      // get header information

      std::set<std::string> list;
      long twidth;
      long theight;
      long tborder;

      loadTiledHeader(getBasicImageIO(name, true), list, prefix, suffix, twidth,
                      theight, tborder, width, height, depth);
    }
    catch (const std::exception &)
    {
      // if loading as tiled image failes, try loading as normal image with colon in file name
      getBasicImageIO(name, true).loadHeader(name, width, height, depth);
    }
  }
  else
  {
    getBasicImageIO(name, true).loadHeader(name, width, height, depth);
  }
}